

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::mark_full_exp_tokens
          (CTcTokenizer *this,CTcTokString *dstbuf,CTcTokString *srcbuf,int append)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int in_ECX;
  CTcTokString *in_RDX;
  long *in_RSI;
  char ch;
  tc_toktyp_t typ;
  CTcHashEntryPp *cur_entry;
  tok_embed_ctx ec;
  char *start;
  CTcToken tok;
  utf8_ptr p;
  CTcHashEntryPp *in_stack_fffffffffffffea8;
  CTcTokenizer *in_stack_fffffffffffffeb0;
  utf8_ptr in_stack_fffffffffffffeb8;
  utf8_ptr in_stack_fffffffffffffee0;
  undefined1 local_115;
  tc_toktyp_t local_114;
  CTcHashEntryPp *local_110;
  int in_stack_ffffffffffffff64;
  tok_embed_ctx *in_stack_ffffffffffffff68;
  CTcToken *in_stack_ffffffffffffff70;
  utf8_ptr *in_stack_ffffffffffffff78;
  CTcTokString *in_stack_ffffffffffffff80;
  char *local_58;
  CTcToken local_50;
  utf8_ptr local_28;
  int local_1c;
  CTcTokString *local_18;
  long *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  utf8_ptr::utf8_ptr(&local_28);
  CTcToken::CTcToken(&local_50);
  tok_embed_ctx::tok_embed_ctx((tok_embed_ctx *)0x2ebbb7);
  if (local_1c == 0) {
    (**(code **)(*local_10 + 0x48))();
  }
  local_58 = CTcTokString::get_text(local_18);
  utf8_ptr::set(&local_28,local_58);
  while (local_114 = next_on_line(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                  in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff64), local_114 != TOKT_EOF) {
    if ((local_114 == TOKT_SYM) && (iVar2 = CTcToken::get_fully_expanded(&local_50), iVar2 == 0)) {
      CTcToken::get_text(&local_50);
      CTcToken::get_text_len(&local_50);
      local_110 = find_define(in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,0x2ebc83);
      if (local_110 != (CTcHashEntryPp *)0x0) {
        in_stack_fffffffffffffee0.p_ = local_28.p_;
        CTcTokString::get_text_end(local_18);
        iVar2 = scan_for_prior_expansion
                          (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                           in_stack_fffffffffffffea8);
        if (iVar2 != 0) {
          pcVar3 = CTcToken::get_text(&local_50);
          plVar1 = local_10;
          if (local_58 < pcVar3) {
            pcVar3 = CTcToken::get_text(&local_50);
            (**(code **)(*plVar1 + 0x20))(plVar1,local_58,(long)pcVar3 - (long)local_58);
          }
          local_115 = 2;
          (**(code **)(*local_10 + 0x20))(local_10,&local_115,1);
          local_58 = CTcToken::get_text(&local_50);
        }
      }
    }
  }
  pcVar3 = CTcToken::get_text(&local_50);
  if (local_58 < pcVar3) {
    pcVar3 = local_58;
    pcVar4 = CTcToken::get_text(&local_50);
    (**(code **)(*local_10 + 0x20))(local_10,pcVar3,(long)pcVar4 - (long)local_58);
  }
  remove_end_markers((CTcTokString *)in_stack_fffffffffffffee0.p_);
  return;
}

Assistant:

void CTcTokenizer::mark_full_exp_tokens(CTcTokString *dstbuf,
                                        const CTcTokString *srcbuf,
                                        int append) const
{
    utf8_ptr p;
    CTcToken tok;
    const char *start;
    tok_embed_ctx ec;

    /* clear the output buffer if we're not appending to existing text */
    if (!append)
        dstbuf->clear_text();

    /* remember the starting point */
    start = srcbuf->get_text();

    /* scan the source buffer */
    p.set((char *)start);
    for (;;)
    {
        CTcHashEntryPp *cur_entry;
        tc_toktyp_t typ;
        char ch;

        /* get the next token; stop at the end of the line */
        typ = next_on_line(srcbuf, &p, &tok, &ec, TRUE);
        if (typ == TOKT_EOF)
            break;

        /* 
         *   if this macro token is being expanded, and it's not already
         *   marked for no more expansion, mark it 
         */
        if (typ == TOKT_SYM
            && !tok.get_fully_expanded()
            && (cur_entry = find_define(tok.get_text(),
                                        tok.get_text_len())) != 0
            && scan_for_prior_expansion(p, srcbuf->get_text_end(), cur_entry))
        {
            /* 
             *   This token has been fully expanded in the substitution
             *   buffer but hasn't yet been marked as such - we must
             *   insert the fully-expanded marker.  First, add up to the
             *   current point to the output buffer.  
             */
            if (tok.get_text() > start)
                dstbuf->append(start, tok.get_text() - start);

            /* add the fully-expanded marker */
            ch = TOK_FULLY_EXPANDED_FLAG;
            dstbuf->append(&ch, 1);

            /* the new starting point is the start of the symbol token */
            start = tok.get_text();
        }
    }

    /* copy any remaining text to the output */
    if (tok.get_text() > start)
        dstbuf->append(start, tok.get_text() - start);

    /* 
     *   Remove any macro expansion end markers from the output buffer.
     *   We don't want to leave these around, because they don't apply to
     *   the enclosing buffer into which we'll substitute this result.
     *   Note that we've already ensured that these markers will be
     *   respected for the substitution text by inserting "fully expanded"
     *   markers in front of each token to which any of the markers we're
     *   removing should apply.  
     */
    remove_end_markers(dstbuf);
}